

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestRunner.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2a17f::TestRunnerFixtureReporterNotifiedOfFailuresHelper::RunImpl
          (TestRunnerFixtureReporterNotifiedOfFailuresHelper *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_f0;
  int local_d0;
  True local_c9;
  undefined1 local_c8 [8];
  MockTest test3;
  undefined1 local_80 [8];
  MockTest test2;
  MockTest test1;
  TestRunnerFixtureReporterNotifiedOfFailuresHelper *this_local;
  
  MockTest::MockTest((MockTest *)&test2.super_Test.m_timeConstraintExempt,"test",false,false,2);
  MockTest::MockTest((MockTest *)local_80,"test",true,false,1);
  MockTest::MockTest((MockTest *)local_c8,"test",false,false,3);
  UnitTest::TestList::Add
            (&(this->super_TestRunnerFixture).list,(Test *)&test2.super_Test.m_timeConstraintExempt)
  ;
  UnitTest::TestList::Add(&(this->super_TestRunnerFixture).list,(Test *)local_80);
  UnitTest::TestList::Add(&(this->super_TestRunnerFixture).list,(Test *)local_c8);
  UnitTest::TestRunner::RunTestsIf<UnitTest::True>
            (&(this->super_TestRunnerFixture).runner,&(this->super_TestRunnerFixture).list,
             (char *)0x0,&local_c9,0);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  local_d0 = 5;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_f0,*ppTVar2,0xa0);
  UnitTest::CheckEqual<int,int>
            (results,&local_d0,&(this->super_TestRunnerFixture).reporter.summaryFailureCount,
             &local_f0);
  MockTest::~MockTest((MockTest *)local_c8);
  MockTest::~MockTest((MockTest *)local_80);
  MockTest::~MockTest((MockTest *)&test2.super_Test.m_timeConstraintExempt);
  return;
}

Assistant:

TEST_FIXTURE(TestRunnerFixture, ReporterNotifiedOfFailures)
{
    MockTest test1("test", false, false, 2);
    MockTest test2("test", true, false);
    MockTest test3("test", false, false, 3);
    list.Add(&test1);
    list.Add(&test2);
    list.Add(&test3);

	runner.RunTestsIf(list, NULL, True(), 0);
	CHECK_EQUAL(5, reporter.summaryFailureCount);
}